

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::DistanceFinder::find
          (SelectionSet *__return_storage_ptr__,DistanceFinder *this,SelectionSet *bs,
          RealType distance,int frame)

{
  SnapshotManager *pSVar1;
  pointer ppSVar2;
  RigidBody *this_00;
  pointer ppMVar3;
  Molecule *this_01;
  StuntDouble *this_02;
  pointer ppBVar4;
  Bond *pBVar5;
  pointer ppBVar6;
  Bend *pBVar7;
  pointer ppTVar8;
  Torsion *pTVar9;
  pointer ppIVar10;
  Inversion *pIVar11;
  bool bVar12;
  int iVar13;
  undefined4 extraout_var;
  ulong uVar14;
  uint uVar15;
  size_t j;
  ulong uVar16;
  double dVar17;
  Vector3d centerPos;
  SelectionSet bsTemp;
  Vector3d r;
  Vector3d r_2;
  Vector<double,_3U> local_c0;
  SelectionSet local_a8;
  _Vector_base<int,_std::allocator<int>_> local_90;
  SelectionSet local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  Snapshot *this_03;
  
  Vector<double,_3U>::Vector(&local_c0);
  pSVar1 = this->info_->sman_;
  iVar13 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)frame);
  this_03 = (Snapshot *)CONCAT44(extraout_var,iVar13);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_90,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
  uVar15 = 0;
  while( true ) {
    ppSVar2 = (this->stuntdoubles_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->stuntdoubles_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <=
        (ulong)uVar15) break;
    this_00 = (RigidBody *)ppSVar2[uVar15];
    if ((this_00 != (RigidBody *)0x0) && ((this_00->super_StuntDouble).objType_ == otRigidBody)) {
      RigidBody::updateAtoms(this_00,frame);
    }
    uVar15 = uVar15 + 1;
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&local_a8.bitsets_,&bs->bitsets_);
  SelectionSet::parallelReduce(&local_78,&local_a8);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            (&local_a8.bitsets_);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_78.bitsets_);
  for (uVar14 = 0;
      uVar14 < (ulong)((local_a8.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_finish.super__Bit_iterator_base._M_offset +
               ((long)((local_a8.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_finish.super__Bit_iterator_base._M_p -
               (long)((local_a8.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p) * 8; uVar14 = uVar14 + 1) {
    bVar12 = OpenMDBitSet::operator[]
                       (local_a8.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start,(int)uVar14);
    if (bVar12) {
      StuntDouble::getPos((Vector3d *)&local_78,
                          (this->stuntdoubles_).
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14],frame);
      Vector<double,_3U>::operator=(&local_c0,(Vector<double,_3U> *)&local_78);
      for (uVar16 = 0;
          ppMVar3 = (this->molecules_).
                    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)((long)(this->molecules_).
                                 super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar3 >> 3);
          uVar16 = uVar16 + 1) {
        this_01 = ppMVar3[uVar16];
        if (this_01 != (Molecule *)0x0) {
          Molecule::getCom((Vector3d *)&local_60,this_01,frame);
          operator-(&local_48,&local_c0,&local_60);
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78,&local_48);
          Snapshot::wrapVector(this_03,(Vector3d *)&local_78);
          dVar17 = Vector<double,_3U>::length((Vector<double,_3U> *)&local_78);
          if (dVar17 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 5,uVar16);
          }
        }
      }
      for (uVar16 = 0;
          ppSVar2 = (this->stuntdoubles_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)((long)(this->stuntdoubles_).
                                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3);
          uVar16 = uVar16 + 1) {
        this_02 = ppSVar2[uVar16];
        if (this_02 != (StuntDouble *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_60,this_02,frame);
          operator-(&local_48,&local_c0,&local_60);
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78,&local_48);
          Snapshot::wrapVector(this_03,(Vector3d *)&local_78);
          dVar17 = Vector<double,_3U>::length((Vector<double,_3U> *)&local_78);
          if (dVar17 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start,uVar16);
          }
        }
      }
      for (uVar16 = 0;
          ppBVar4 = (this->bonds_).
                    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar16 < (ulong)((long)(this->bonds_).
                                 super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar4 >> 3);
          uVar16 = uVar16 + 1) {
        pBVar5 = ppBVar4[uVar16];
        if (pBVar5 != (Bond *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pBVar5->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,frame);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->bonds_).
                                           super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,2.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_03,(Vector3d *)&local_48);
          dVar17 = Vector<double,_3U>::length(&local_48);
          if (dVar17 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,uVar16);
          }
        }
      }
      for (uVar16 = 0;
          ppBVar6 = (this->bends_).
                    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar16 < (ulong)((long)(this->bends_).
                                 super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar6 >> 3);
          uVar16 = uVar16 + 1) {
        pBVar7 = ppBVar6[uVar16];
        if (pBVar7 != (Bend *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pBVar7->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,frame);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->bends_).
                                           super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->bends_).
                                           super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,3.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_03,(Vector3d *)&local_48);
          dVar17 = Vector<double,_3U>::length(&local_48);
          if (dVar17 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2,uVar16);
          }
        }
      }
      for (uVar16 = 0;
          ppTVar8 = (this->torsions_).
                    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)((long)(this->torsions_).
                                 super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8 >> 3);
          uVar16 = uVar16 + 1) {
        pTVar9 = ppTVar8[uVar16];
        if (pTVar9 != (Torsion *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pTVar9->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,frame);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->torsions_).
                                           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->torsions_).
                                           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->torsions_).
                                           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x18),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,4.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_03,(Vector3d *)&local_48);
          dVar17 = Vector<double,_3U>::length(&local_48);
          if (dVar17 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 3,uVar16);
          }
        }
      }
      for (uVar16 = 0;
          ppIVar10 = (this->inversions_).
                     super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)((long)(this->inversions_).
                                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar10 >> 3);
          uVar16 = uVar16 + 1) {
        pIVar11 = ppIVar10[uVar16];
        if (pIVar11 != (Inversion *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pIVar11->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,frame);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->inversions_).
                                           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->inversions_).
                                           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->inversions_).
                                           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x18),frame);
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,4.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_03,(Vector3d *)&local_48);
          dVar17 = Vector<double,_3U>::length(&local_48);
          if (dVar17 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4,uVar16);
          }
        }
      }
    }
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_a8.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet DistanceFinder::find(const SelectionSet& bs, RealType distance,
                                    int frame) {
    StuntDouble* center;
    Vector3d centerPos;
    Snapshot* currSnapshot = info_->getSnapshotManager()->getSnapshot(frame);
    SelectionSet bsResult(nObjects_);
    assert(bsResult.size() == bs.size());

#ifdef IS_MPI
    int mol;
    int proc;
    RealType data[3];
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (unsigned int j = 0; j < stuntdoubles_.size(); ++j) {
      if (stuntdoubles_[j] != NULL) {
        if (stuntdoubles_[j]->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(stuntdoubles_[j]);
          rb->updateAtoms(frame);
        }
      }
    }

    SelectionSet bsTemp = bs;
    bsTemp              = bsTemp.parallelReduce();

    for (size_t i = 0; i < bsTemp.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (bsTemp.bitsets_[STUNTDOUBLE][i]) {
        // Now, if we own stuntdouble i, we can use the position, but in
        // parallel, we'll need to let everyone else know what that
        // position is!

#ifdef IS_MPI
        mol  = info_->getGlobalMolMembership(i);
        proc = info_->getMolToProc(mol);

        if (proc == worldRank) {
          center    = stuntdoubles_[i];
          centerPos = center->getPos(frame);
          data[0]   = centerPos.x();
          data[1]   = centerPos.y();
          data[2]   = centerPos.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
          centerPos = Vector3d(data);
        }
#else
        center    = stuntdoubles_[i];
        centerPos = center->getPos(frame);
#endif
        for (size_t j = 0; j < molecules_.size(); ++j) {
          if (molecules_[j] != NULL) {
            Vector3d r = centerPos - molecules_[j]->getCom(frame);
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[MOLECULE].setBitOn(j);
            }
          }
        }

        for (size_t j = 0; j < stuntdoubles_.size(); ++j) {
          if (stuntdoubles_[j] != NULL) {
            Vector3d r = centerPos - stuntdoubles_[j]->getPos(frame);
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[STUNTDOUBLE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < bonds_.size(); ++j) {
          if (bonds_[j] != NULL) {
            Vector3d loc = bonds_[j]->getAtomA()->getPos(frame);
            loc += bonds_[j]->getAtomB()->getPos(frame);
            loc        = loc / 2.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BOND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < bends_.size(); ++j) {
          if (bends_[j] != NULL) {
            Vector3d loc = bends_[j]->getAtomA()->getPos(frame);
            loc += bends_[j]->getAtomB()->getPos(frame);
            loc += bends_[j]->getAtomC()->getPos(frame);
            loc        = loc / 3.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BEND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < torsions_.size(); ++j) {
          if (torsions_[j] != NULL) {
            Vector3d loc = torsions_[j]->getAtomA()->getPos(frame);
            loc += torsions_[j]->getAtomB()->getPos(frame);
            loc += torsions_[j]->getAtomC()->getPos(frame);
            loc += torsions_[j]->getAtomD()->getPos(frame);
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[TORSION].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < inversions_.size(); ++j) {
          if (inversions_[j] != NULL) {
            Vector3d loc = inversions_[j]->getAtomA()->getPos(frame);
            loc += inversions_[j]->getAtomB()->getPos(frame);
            loc += inversions_[j]->getAtomC()->getPos(frame);
            loc += inversions_[j]->getAtomD()->getPos(frame);
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[INVERSION].setBitOn(j);
            }
          }
        }
      }
    }
    return bsResult;
  }